

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_19baad::BuildSystemFrontendExecutionQueueDelegate::processStarted
          (BuildSystemFrontendExecutionQueueDelegate *this,ProcessContext *command,
          ProcessHandle handle,llbuild_pid_t pid)

{
  BuildSystem *this_00;
  BuildSystemDelegate *pBVar1;
  
  this_00 = getSystem(this);
  pBVar1 = llbuild::buildsystem::BuildSystem::getDelegate(this_00);
  (*pBVar1->_vptr_BuildSystemDelegate[0x17])
            (pBVar1,command,handle.id,pBVar1->_vptr_BuildSystemDelegate[0x17]);
  return;
}

Assistant:

virtual void processStarted(ProcessContext* command,
                              ProcessHandle handle,
                              llbuild_pid_t pid) override {
    static_cast<BuildSystemFrontendDelegate*>(&getSystem().getDelegate())->
      commandProcessStarted(
          reinterpret_cast<Command*>(command),
          BuildSystemFrontendDelegate::ProcessHandle { handle.id });
  }